

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

void __thiscall DMovePoly::DMovePoly(DMovePoly *this,int polyNum)

{
  DPolyAction::DPolyAction(&this->super_DPolyAction,polyNum);
  (this->super_DPolyAction).super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_007cd1e0;
  (this->m_Angle).Degrees = 0.0;
  (this->m_Speedv).X = 0.0;
  (this->m_Speedv).Y = 0.0;
  return;
}

Assistant:

DMovePoly::DMovePoly (int polyNum)
	: Super (polyNum)
{
	m_Angle = 0.;
	m_Speedv = { 0,0 };
}